

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O0

bool verifyResult(string *objI,string *objJ,double distance,Point3 *p1,Point3 *p2)

{
  bool bVar1;
  byte local_2fa;
  byte local_2e2;
  byte local_2ca;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  byte local_129;
  double dStack_128;
  bool res;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  undefined1 local_80 [8];
  Point3 dp2;
  double local_60;
  double local_58;
  undefined1 local_50 [8];
  Point3 dp1;
  double dd;
  Point3 *p2_local;
  Point3 *p1_local;
  double distance_local;
  string *objJ_local;
  string *objI_local;
  
  dp1.m_z = 0.0;
  local_58 = 0.0;
  local_60 = 0.0;
  dp2.m_z = 0.0;
  p1_local = (Point3 *)distance;
  distance_local = (double)objJ;
  objJ_local = objI;
  CD_Matrix::Vector3T<double,_false>::Vector3T
            ((Vector3T<double,_false> *)local_50,&local_58,&local_60,&dp2.m_z);
  local_88 = 0.0;
  local_90 = 0.0;
  local_98 = 0.0;
  CD_Matrix::Vector3T<double,_false>::Vector3T
            ((Vector3T<double,_false> *)local_80,&local_88,&local_90,&local_98);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          distance_local,"poly");
  if ((bVar1) && (bVar1 = std::operator==(objJ_local,"stp1"), bVar1)) {
    dp1.m_z = -0.003622207057881;
    local_a0 = 0.157367547718;
    local_a8 = 0.68942718023;
    local_b0 = 0.891961713557;
    CD_Matrix::Vector3T<double,_false>::Set
              ((Vector3T<double,_false> *)local_50,&local_a0,&local_a8,&local_b0);
    local_b8 = 0.0986621048016;
    local_c0 = 0.691217002621;
    local_c8 = 0.905102283015;
    CD_Matrix::Vector3T<double,_false>::Set
              ((Vector3T<double,_false> *)local_80,&local_b8,&local_c0,&local_c8);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            distance_local,"poly");
    if ((bVar1) && (bVar1 = std::operator==(objJ_local,"stp2"), bVar1)) {
      dp1.m_z = 1.052877530262;
      local_d0 = 0.113009188603;
      local_d8 = 0.657740931859;
      local_e0 = 0.866412634224;
      CD_Matrix::Vector3T<double,_false>::Set
                ((Vector3T<double,_false> *)local_50,&local_d0,&local_d8,&local_e0);
      local_e8 = 0.404379849329;
      local_f0 = 0.0191152898235;
      local_f8 = 0.117988985704;
      CD_Matrix::Vector3T<double,_false>::Set
                ((Vector3T<double,_false> *)local_80,&local_e8,&local_f0,&local_f8);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              distance_local,"stp1");
      if ((bVar1) && (bVar1 = std::operator==(objJ_local,"stp2"), bVar1)) {
        dp1.m_z = 0.7165631886362;
        local_100 = 0.167062414197;
        local_108 = 0.581943658784;
        local_110 = 0.704052592159;
        CD_Matrix::Vector3T<double,_false>::Set
                  ((Vector3T<double,_false> *)local_50,&local_100,&local_108,&local_110);
        local_118 = 0.404383200422;
        local_120 = 0.0191578029975;
        dStack_128 = 0.117951821311;
        CD_Matrix::Vector3T<double,_false>::Set
                  ((Vector3T<double,_false> *)local_80,&local_118,&local_120,
                   &stack0xfffffffffffffed8);
      }
    }
  }
  local_129 = 1;
  std::operator+(&local_1b0,"distance (",objJ_local);
  std::operator+(&local_190,&local_1b0,", ");
  std::operator+(&local_170,&local_190,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)distance_local
                );
  std::operator+(&local_150,&local_170,"): ");
  bVar1 = compare<double>((double *)&p1_local,&dp1.m_z,&local_150,1e-12);
  local_2ca = 0;
  if (bVar1) {
    local_2ca = local_129;
  }
  local_129 = local_2ca & 1;
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::operator+(&local_240,"p1 (",objJ_local);
  std::operator+(&local_220,&local_240,", ");
  std::operator+(&local_200,&local_220,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)distance_local
                );
  std::operator+(&local_1e0,&local_200,"): ");
  bVar1 = compare(p1,(Vector3 *)local_50,&local_1e0,1e-12);
  local_2e2 = 0;
  if (bVar1) {
    local_2e2 = local_129;
  }
  local_129 = local_2e2 & 1;
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::operator+(&local_2c0,"p2 (",objJ_local);
  std::operator+(&local_2a0,&local_2c0,", ");
  std::operator+(&local_280,&local_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)distance_local
                );
  std::operator+(&local_260,&local_280,"): ");
  bVar1 = compare(p2,(Vector3 *)local_80,&local_260,1e-12);
  local_2fa = 0;
  if (bVar1) {
    local_2fa = local_129;
  }
  local_129 = local_2fa & 1;
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2c0);
  return (bool)(local_129 & 1);
}

Assistant:

bool verifyResult(const std::string & objI, const std::string & objJ,
                  double distance,
                  const Point3 & p1, const Point3 & p2)
{
  double dd(0);
  Point3 dp1(0, 0, 0);
  Point3 dp2(0, 0, 0);

  if(objJ== "poly" && objI == "stp1")
  {
#ifdef SCH_BUILD_BSD
    dd = 0.;
    dp1.Set(0.121221802197878, 0.759159100278684162432796, 0.8579643029474862681027);
    dp2.Set(0.131381168845752, 0.628304262885003295124874, 0.8892843622212902587875);
#else
    dd = -0.003622207057881;
    dp1.Set( 0.157367547718, 0.68942718023, 0.891961713557);
    dp2.Set(0.0986621048016, 0.691217002621, 0.905102283015);
#endif
  }
  else if(objJ == "poly" && objI == "stp2")
  {
    dd = 1.052877530262;
    dp1.Set(0.113009188603, 0.657740931859, 0.866412634224);
    dp2.Set(0.404379849329, 0.0191152898235, 0.117988985704);
  }
  else if(objJ == "stp1" && objI == "stp2")
  {
    dd = 0.7165631886362;
    dp1.Set(0.167062414197, 0.581943658784, 0.704052592159);
    dp2.Set(0.404383200422, 0.0191578029975, 0.117951821311);
  }

  bool res = true;
  res = compare(distance, dd, "distance ("+objI +", "+objJ+"): ") && res;
  res = compare(p1, dp1, "p1 ("+objI +", "+objJ+"): ") && res;
  res = compare(p2, dp2, "p2 ("+objI +", "+objJ+"): ") && res;
  return res;
}